

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O3

bool ot::commissioner::tlv::IsExtendedTlv(Type aType)

{
  return (bool)((byte)(0x8001000000020000 >> (aType & kCommissionerToken)) &
               aType < kCommissionerSignature);
}

Assistant:

bool IsExtendedTlv(Type aType)
{
    switch (aType)
    {
    case Type::kUdpEncapsulation:
    case Type::kCommissionerToken:
    case Type::kJoinerDtlsEncapsulation:
        return true;
    default:
        return false;
    }
}